

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_bool_test.cpp
# Opt level: O0

void __thiscall
reflect_value_cast_bool_test_bool_to_char_cast_Test::TestBody
          (reflect_value_cast_bool_test_bool_to_char_cast_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  uchar b;
  value v;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar2;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  AssertHelper local_50;
  Message local_48 [3];
  undefined1 local_2a;
  undefined1 local_29;
  AssertionResult local_28;
  undefined1 local_11;
  undefined8 local_10;
  
  uVar2 = 1;
  local_10 = value_create_bool();
  local_11 = value_to_bool(local_10);
  local_10 = value_type_cast(local_10,uVar2);
  local_29 = local_11;
  local_2a = value_to_char(local_10);
  this_00 = &local_28;
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            ((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
             &this_00->success_,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x115c62);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_bool_test.cpp"
               ,0x34,message);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x115cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115cf0);
  value_destroy(local_10);
  return;
}

Assistant:

TEST_F(reflect_value_cast_bool_test, bool_to_char_cast)
{
	value v = value_create_bool(1L);

	boolean b = value_to_bool(v);

	v = value_type_cast(v, TYPE_CHAR);

	EXPECT_EQ((char)b, (char)value_to_char(v));

	value_destroy(v);
}